

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

bool __thiscall RenX::Server::fetchClientList(Server *this)

{
  int iVar1;
  rep rVar2;
  char *pcVar3;
  string_view text;
  string_view text_00;
  string_view text_01;
  
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastClientListUpdate).__d.__r = rVar2;
  if (this->m_rconVersion < 4) {
    text_00._M_str = anon_var_dwarf_5f41d;
    text_00._M_len = 0x5a;
    iVar1 = sendSocket(this,text_00);
    if (iVar1 < 1) {
      return false;
    }
    pcVar3 = anon_var_dwarf_5f434;
  }
  else {
    text._M_str = 
    "cclientvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PING ADMIN STEAM IP HWID PLAYERLOG\n"
    ;
    text._M_len = 0x5f;
    iVar1 = sendSocket(this,text);
    if (iVar1 < 1) {
      return false;
    }
    pcVar3 = "cbotvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PLAYERLOG\n";
  }
  text_01._M_str = pcVar3;
  text_01._M_len = 0x43;
  iVar1 = sendSocket(this,text_01);
  return 0 < iVar1;
}

Assistant:

bool RenX::Server::fetchClientList() {
	m_lastClientListUpdate = std::chrono::steady_clock::now();
	// TODO: remove all support for rconVersion < 4
	if (m_rconVersion >= 4) {
		return sendSocket("cclientvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PING ADMIN STEAM IP HWID PLAYERLOG\n"sv) > 0
			&& sendSocket("cbotvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PLAYERLOG\n"sv) > 0;
	}

	return sendSocket("cclientvarlist KILLS\xA0""DEATHS\xA0""SCORE\xA0""CREDITS\xA0""CHARACTER\xA0""VEHICLE\xA0""PING\xA0""ADMIN\xA0""STEAM\xA0""IP\xA0""PLAYERLOG\n"sv) > 0
		&& sendSocket("cbotvarlist KILLS\xA0""DEATHS\xA0""SCORE\xA0""CREDITS\xA0""CHARACTER\xA0""VEHICLE\xA0""PLAYERLOG\n"sv) > 0;
}